

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O3

void Io_NtkWriteNodeIntStruct(FILE *pFile,Abc_Obj_t *pNode,Vec_Int_t *vCover,char *pStr)

{
  word *pwVar1;
  uint nInputs;
  word *pwVar2;
  undefined4 uVar3;
  word wVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  int *piVar8;
  char *pcVar9;
  void ***pppvVar10;
  char *pcVar11;
  int nLutRoot;
  ulong uVar12;
  long lVar13;
  undefined8 uVar14;
  int iVar15;
  ulong uVar16;
  int nLutLeaf;
  uint uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  word Func1;
  word Func0;
  char pLut2 [32];
  word Func2;
  char pLut1 [32];
  char pLut0 [32];
  word pRes [1024];
  word pCube [1024];
  
  nInputs = (pNode->vFanins).nSize;
  sVar6 = strlen(pStr);
  iVar5 = (int)sVar6;
  if (iVar5 - 4U < 0xfffffffe) {
    printf("Wrong LUT struct (%s)\n",pStr);
    return;
  }
  uVar12 = 0;
  do {
    if ((byte)(pStr[uVar12] - 0x37U) < 0xfc) {
      printf("The LUT size (%d) should belong to {3,4,5,6}.\n",(ulong)((int)pStr[uVar12] - 0x30));
      return;
    }
    uVar12 = uVar12 + 1;
  } while ((sVar6 & 0xffffffff) != uVar12);
  iVar18 = 0;
  if (iVar5 == 3) {
    iVar18 = pStr[1] + -0x30;
  }
  iVar15 = iVar18 + -1;
  if (iVar18 == 0) {
    iVar15 = 0;
  }
  if ((int)pStr[iVar5 - 1] + iVar15 + *pStr + -0x61 < (int)nInputs) {
    printf("The node size (%d) is too large for the LUT structure %s.\n",(ulong)nInputs,pStr);
    return;
  }
  nLutLeaf = *pStr + -0x30;
  nLutRoot = pStr[iVar5 - 1] + -0x30;
  fputc(10,(FILE *)pFile);
  iVar15 = nLutRoot;
  if (nLutRoot < nLutLeaf) {
    iVar15 = nLutLeaf;
  }
  if (iVar15 < iVar18) {
    iVar15 = iVar18;
  }
  if ((int)nInputs <= iVar15) {
    fwrite(".names",6,1,(FILE *)pFile);
    if (0 < (pNode->vFanins).nSize) {
      lVar13 = 0;
      do {
        pcVar11 = Abc_ObjName((Abc_Obj_t *)
                              pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar13]]);
        fprintf((FILE *)pFile," %s",pcVar11);
        lVar13 = lVar13 + 1;
      } while (lVar13 < (pNode->vFanins).nSize);
    }
    pcVar11 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    fprintf((FILE *)pFile," %s\n",pcVar11);
    fputs((char *)(pNode->field_5).pData,(FILE *)pFile);
    return;
  }
  pLut2[0x10] = '\0';
  pLut2[0x11] = '\0';
  pLut2[0x12] = '\0';
  pLut2[0x13] = '\0';
  pLut2[0x14] = '\0';
  pLut2[0x15] = '\0';
  pLut2[0x16] = '\0';
  pLut2[0x17] = '\0';
  pLut2[0x18] = '\0';
  pLut2[0x19] = '\0';
  pLut2[0x1a] = '\0';
  pLut2[0x1b] = '\0';
  pLut2[0x1c] = '\0';
  pLut2[0x1d] = '\0';
  pLut2[0x1e] = '\0';
  pLut2[0x1f] = '\0';
  pLut2[0] = '\0';
  pLut2[1] = '\0';
  pLut2[2] = '\0';
  pLut2[3] = '\0';
  pLut2[4] = '\0';
  pLut2[5] = '\0';
  pLut2[6] = '\0';
  pLut2[7] = '\0';
  pLut2[8] = '\0';
  pLut2[9] = '\0';
  pLut2[10] = '\0';
  pLut2[0xb] = '\0';
  pLut2[0xc] = '\0';
  pLut2[0xd] = '\0';
  pLut2[0xe] = '\0';
  pLut2[0xf] = '\0';
  if (Io_NtkWriteNodeIntStruct::TruthStore[0][0] == 0) {
    lVar19 = 0;
    lVar20 = 1;
    lVar13 = 0;
    do {
      *(word (**) [1024])((long)Io_NtkWriteNodeIntStruct::pTruths + lVar13) =
           Io_NtkWriteNodeIntStruct::TruthStore + lVar19;
      *(word (**) [1024])((long)Io_NtkWriteNodeIntStruct::pTruths + lVar13 + 8) =
           Io_NtkWriteNodeIntStruct::TruthStore + lVar20;
      lVar19 = lVar19 + 2;
      lVar20 = lVar20 + 2;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x80);
    lVar13 = 0;
    do {
      pwVar2 = Io_NtkWriteNodeIntStruct::pTruths[lVar13];
      wVar4 = Io_NtkWriteNodeIntStruct::Truth6[lVar13];
      uVar3 = *(undefined4 *)((long)Io_NtkWriteNodeIntStruct::Truth6 + lVar13 * 8 + 4);
      lVar19 = 0;
      do {
        pwVar1 = pwVar2 + lVar19;
        *(int *)pwVar1 = (int)wVar4;
        *(undefined4 *)((long)pwVar1 + 4) = uVar3;
        *(int *)(pwVar1 + 1) = (int)wVar4;
        *(undefined4 *)((long)pwVar1 + 0xc) = uVar3;
        lVar19 = lVar19 + 2;
      } while (lVar19 != 0x400);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 6);
    lVar13 = 6;
    do {
      pwVar2 = Io_NtkWriteNodeIntStruct::pTruths[lVar13];
      uVar17 = 1 << ((char)lVar13 - 6U & 0x1f);
      lVar19 = 0;
      uVar21 = 0;
      uVar22 = 1;
      do {
        uVar23 = uVar17 & uVar21;
        uVar24 = uVar17 & uVar22;
        pwVar1 = pwVar2 + lVar19;
        *(uint *)pwVar1 = -(uint)(uVar23 == 0) ^ 0xffffffff;
        *(uint *)((long)pwVar1 + 4) = -(uint)(uVar23 == 0) ^ 0xffffffff;
        *(uint *)(pwVar1 + 1) = -(uint)(uVar24 == 0) ^ 0xffffffff;
        *(uint *)((long)pwVar1 + 0xc) = -(uint)(uVar24 == 0) ^ 0xffffffff;
        lVar19 = lVar19 + 2;
        uVar21 = uVar21 + 2;
        uVar22 = uVar22 + 2;
      } while (lVar19 != 0x400);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x10);
  }
  Abc_SopToTruthBig((char *)(pNode->field_5).pData,nInputs,Io_NtkWriteNodeIntStruct::pTruths,pCube,
                    pRes);
  uVar21 = 1 << ((char)nInputs - 5U & 0x1f);
  if ((int)nInputs < 6) {
    uVar21 = 1;
  }
  uVar16 = (ulong)uVar21;
  uVar12 = uVar16;
  do {
    if ((int)uVar12 < 1) goto LAB_00321770;
    lVar13 = uVar12 * 4;
    uVar12 = uVar12 - 1;
    uVar7 = uVar16;
  } while (*(int *)((long)pRes + lVar13 + -4) == 0);
  do {
    if ((int)uVar7 < 1) goto LAB_00321770;
    lVar13 = uVar7 * 4;
    uVar7 = uVar7 - 1;
  } while (*(int *)((long)pRes + lVar13 + -4) == -1);
  if (iVar5 == 2) {
    iVar18 = If_CluCheckExt((void *)0x0,pRes,nInputs,nLutLeaf,nLutRoot,pLut0,pLut1,&Func0,&Func1);
    if (iVar18 != 0) {
LAB_00321826:
      fwrite(".names",6,1,(FILE *)pFile);
      if ('\0' < pLut1[0]) {
        lVar13 = 0;
        do {
          pcVar11 = Abc_ObjName((Abc_Obj_t *)
                                pNode->pNtk->vObjs->pArray
                                [(pNode->vFanins).pArray[pLut1[lVar13 + 2]]]);
          fprintf((FILE *)pFile," %s",pcVar11);
          lVar13 = lVar13 + 1;
        } while (lVar13 < pLut1[0]);
      }
      pcVar11 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
      fprintf((FILE *)pFile," %s_lut1\n",pcVar11);
      pcVar11 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func1,(int)pLut1[0],vCover);
      fputs(pcVar11,(FILE *)pFile);
      if ((iVar5 == 3) && ('\0' < pLut2[0])) {
        fwrite(".names",6,1,(FILE *)pFile);
        if ('\0' < pLut2[0]) {
          lVar13 = 0;
          do {
            if (nInputs == (int)pLut2[lVar13 + 2]) {
              piVar8 = (pNode->vFanouts).pArray;
              pcVar11 = " %s_lut1";
            }
            else {
              piVar8 = (pNode->vFanins).pArray + (int)pLut2[lVar13 + 2];
              pcVar11 = " %s";
            }
            pcVar9 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*piVar8]);
            fprintf((FILE *)pFile,pcVar11,pcVar9);
            lVar13 = lVar13 + 1;
          } while (lVar13 < pLut2[0]);
        }
        pcVar11 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
        fprintf((FILE *)pFile," %s_lut2\n",pcVar11);
        pcVar11 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func2,(int)pLut2[0],vCover);
        fputs(pcVar11,(FILE *)pFile);
      }
      fwrite(".names",6,1,(FILE *)pFile);
      if ('\0' < pLut0[0]) {
        lVar13 = 0;
        do {
          uVar21 = (uint)pLut0[lVar13 + 2];
          if (nInputs == uVar21) {
            piVar8 = (pNode->vFanouts).pArray;
            pppvVar10 = &pNode->pNtk->vObjs->pArray;
            pcVar11 = " %s_lut1";
          }
          else {
            pppvVar10 = &pNode->pNtk->vObjs->pArray;
            if (nInputs + 1 == uVar21) {
              piVar8 = (pNode->vFanouts).pArray;
              pcVar11 = " %s_lut2";
            }
            else {
              piVar8 = (pNode->vFanins).pArray + (int)uVar21;
              pcVar11 = " %s";
            }
          }
          pcVar9 = Abc_ObjName((Abc_Obj_t *)(*pppvVar10)[*piVar8]);
          fprintf((FILE *)pFile,pcVar11,pcVar9);
          lVar13 = lVar13 + 1;
        } while (lVar13 < pLut0[0]);
      }
      pcVar11 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
      fprintf((FILE *)pFile," %s\n",pcVar11);
      pcVar11 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func0,(int)pLut0[0],vCover);
      fputs(pcVar11,(FILE *)pFile);
      return;
    }
    Extra_PrintHex(_stdout,(uint *)pRes,nInputs);
    printf("    ");
  }
  else {
    iVar18 = If_CluCheckExt3((void *)0x0,pRes,nInputs,nLutLeaf,iVar18,nLutRoot,pLut0,pLut1,pLut2,
                             &Func0,&Func1,&Func2);
    if (iVar18 != 0) goto LAB_00321826;
    Extra_PrintHex(_stdout,(uint *)pRes,nInputs);
    printf("    ");
  }
  Kit_DsdPrintFromTruth((uint *)pRes,nInputs);
  putchar(10);
  pcVar11 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
  printf("Node \"%s\" is not decomposable. Writing BLIF has failed.\n",pcVar11);
  return;
LAB_00321770:
  pcVar11 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
  do {
    if ((int)uVar16 < 1) {
      uVar14 = 1;
      goto LAB_003217a6;
    }
    lVar13 = uVar16 * 4;
    uVar16 = uVar16 - 1;
  } while (*(int *)((long)pRes + lVar13 + -4) == -1);
  uVar14 = 0;
LAB_003217a6:
  fprintf((FILE *)pFile,".names %s\n %d\n",pcVar11,uVar14);
  return;
}

Assistant:

void Io_NtkWriteNodeIntStruct( FILE * pFile, Abc_Obj_t * pNode, Vec_Int_t * vCover, char * pStr )
{
    Abc_Obj_t * pNet;
    int nLeaves = Abc_ObjFaninNum(pNode);
    int i, nLutLeaf, nLutLeaf2, nLutRoot, Length;

    // quit if parameters are wrong
    Length = strlen(pStr);
    if ( Length != 2 && Length != 3 )
    {
        printf( "Wrong LUT struct (%s)\n", pStr );
        return;
    }
    for ( i = 0; i < Length; i++ )
        if ( pStr[i] - '0' < 3 || pStr[i] - '0' > 6 )
        {
            printf( "The LUT size (%d) should belong to {3,4,5,6}.\n", pStr[i] - '0' );
            return;
        }

    nLutLeaf  =                   pStr[0] - '0';
    nLutLeaf2 = ( Length == 3 ) ? pStr[1] - '0' : 0;
    nLutRoot  =                   pStr[Length-1] - '0';
    if ( nLeaves > nLutLeaf - 1 + (nLutLeaf2 ? nLutLeaf2 - 1 : 0) + nLutRoot )
    {
        printf( "The node size (%d) is too large for the LUT structure %s.\n", nLeaves, pStr );
        return;
    }

    // consider easy case
    fprintf( pFile, "\n" );
    if ( nLeaves <= Abc_MaxInt( nLutLeaf2, Abc_MaxInt(nLutLeaf, nLutRoot) ) )
    {
        // write the .names line
        fprintf( pFile, ".names" );
        Abc_ObjForEachFanin( pNode, pNet, i )
            fprintf( pFile, " %s", Abc_ObjName(pNet) );
        // get the output name
        fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        // write the cubes
        fprintf( pFile, "%s", (char*)Abc_ObjData(pNode) );
        return;
    }
    else
    {
        extern int If_CluMinimumBase( word * t, int * pSupp, int nVarsAll, int * pnVars );

        static word TruthStore[16][1<<10] = {{0}}, * pTruths[16];
        word pCube[1<<10], pRes[1<<10], Func0, Func1, Func2;
        char pLut0[32], pLut1[32], pLut2[32] = {0}, * pSop;
//        int nVarsMin[3], pVars[3][20];

        if ( TruthStore[0][0] == 0 )
        {
            static word Truth6[6] = {
                ABC_CONST(0xAAAAAAAAAAAAAAAA),
                ABC_CONST(0xCCCCCCCCCCCCCCCC),
                ABC_CONST(0xF0F0F0F0F0F0F0F0),
                ABC_CONST(0xFF00FF00FF00FF00),
                ABC_CONST(0xFFFF0000FFFF0000),
                ABC_CONST(0xFFFFFFFF00000000)
            };
            int nVarsMax = 16;
            int nWordsMax = (1 << 10);
            int i, k;
            assert( nVarsMax <= 16 );
            for ( i = 0; i < nVarsMax; i++ )
                pTruths[i] = TruthStore[i];
            for ( i = 0; i < 6; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = Truth6[i];
            for ( i = 6; i < nVarsMax; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;
        }

        // collect variables
//        Abc_ObjForEachFanin( pNode, pNet, i )
//            pVars[0][i] = pVars[1][i] = pVars[2][i] = i;

        // derive truth table
        Abc_SopToTruthBig( (char*)Abc_ObjData(pNode), nLeaves, pTruths, pCube, pRes );
        if ( Kit_TruthIsConst0((unsigned *)pRes, nLeaves) || Kit_TruthIsConst1((unsigned *)pRes, nLeaves) )
        {
            fprintf( pFile, ".names %s\n %d\n", Abc_ObjName(Abc_ObjFanout0(pNode)), Kit_TruthIsConst1((unsigned *)pRes, nLeaves) );
            return;
        }

//        Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
//        Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );

        // perform decomposition
        if ( Length == 2 )
        {
            if ( !If_CluCheckExt( NULL, pRes, nLeaves, nLutLeaf, nLutRoot, pLut0, pLut1, &Func0, &Func1 ) )
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                return;
            }
        }
        else
        {
            if ( !If_CluCheckExt3( NULL, pRes, nLeaves, nLutLeaf, nLutLeaf2, nLutRoot, pLut0, pLut1, pLut2, &Func0, &Func1, &Func2 ) )
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                return;
            }
        }

        // write leaf node
        fprintf( pFile, ".names" );
        for ( i = 0; i < pLut1[0]; i++ )
            fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pLut1[2+i])) );
        fprintf( pFile, " %s_lut1\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        // write SOP
        pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func1, pLut1[0], vCover );
        fprintf( pFile, "%s", pSop );

        if ( Length == 3 && pLut2[0] > 0 )
        {
            // write leaf node
            fprintf( pFile, ".names" );
            for ( i = 0; i < pLut2[0]; i++ )
                if ( pLut2[2+i] == nLeaves )
                    fprintf( pFile, " %s_lut1", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                else
                    fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pLut2[2+i])) );
            fprintf( pFile, " %s_lut2\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            // write SOP
            pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func2, pLut2[0], vCover );
            fprintf( pFile, "%s", pSop );
        }

        // write root node
        fprintf( pFile, ".names" );
        for ( i = 0; i < pLut0[0]; i++ )
            if ( pLut0[2+i] == nLeaves )
                fprintf( pFile, " %s_lut1", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            else if ( pLut0[2+i] == nLeaves+1 )
                fprintf( pFile, " %s_lut2", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            else
                fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pLut0[2+i])) );
        fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        // write SOP
        pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func0, pLut0[0], vCover );
        fprintf( pFile, "%s", pSop );
    }
}